

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O2

int lua_loadx(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  uint64_t uVar1;
  int iVar2;
  LexState local_d0;
  
  local_d0.chunkarg = "?";
  if (chunkname != (char *)0x0) {
    local_d0.chunkarg = chunkname;
  }
  local_d0.sb.w = (char *)0x0;
  local_d0.sb.e = (char *)0x0;
  local_d0.sb.b = (char *)0x0;
  local_d0.sb.L.ptr64 = (uint64_t)L;
  local_d0.rfunc = reader;
  local_d0.rdata = data;
  local_d0.mode = mode;
  iVar2 = lj_vm_cpcall(L,0,&local_d0,cpparser);
  lj_lex_cleanup(L,&local_d0);
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return iVar2;
}

Assistant:

LUA_API int lua_loadx(lua_State *L, lua_Reader reader, void *data,
		      const char *chunkname, const char *mode)
{
  LexState ls;
  int status;
  ls.rfunc = reader;
  ls.rdata = data;
  ls.chunkarg = chunkname ? chunkname : "?";
  ls.mode = mode;
  lj_buf_init(L, &ls.sb);
  status = lj_vm_cpcall(L, NULL, &ls, cpparser);
  lj_lex_cleanup(L, &ls);
  lj_gc_check(L);
  return status;
}